

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O0

Vector_filtration_value *
random_filtration_vec<Gudhi::Vector_filtration_value>
          (Vector_filtration_value *__return_storage_ptr__,value_type_conflict1 lower_bound,
          value_type_conflict1 upper_bound,uint number_of_parameters)

{
  result_type_conflict2 rVar1;
  result_type rVar2;
  reference pvVar3;
  uint local_274c;
  uint i;
  undefined1 local_2738 [8];
  mt19937 rand_engine;
  random_device rand_dev;
  uniform_int_distribution<int> unif;
  uint number_of_parameters_local;
  value_type_conflict1 upper_bound_local;
  value_type_conflict1 lower_bound_local;
  Vector_filtration_value *res;
  
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)((long)&rand_dev.field_0._M_mt._M_p + 4),lower_bound,
             upper_bound);
  std::random_device::random_device((random_device *)&rand_engine._M_p);
  rVar1 = std::random_device::operator()((random_device *)&rand_engine._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2738,(ulong)rVar1);
  Gudhi::Vector_filtration_value::Vector_filtration_value
            (__return_storage_ptr__,(ulong)number_of_parameters);
  for (local_274c = 0; local_274c < number_of_parameters; local_274c = local_274c + 1) {
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)((long)&rand_dev.field_0._M_mt._M_p + 4),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2738);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
                        (ulong)local_274c);
    *pvVar3 = rVar2;
  }
  std::random_device::~random_device((random_device *)&rand_engine._M_p);
  return __return_storage_ptr__;
}

Assistant:

Filtration_type random_filtration_vec(typename Filtration_type::value_type lower_bound = 0,
                                      typename Filtration_type::value_type upper_bound = 10,
                                      unsigned int number_of_parameters = 2)
{
  std::uniform_int_distribution<typename Filtration_type::value_type> unif(lower_bound, upper_bound);
  std::random_device rand_dev;
  std::mt19937 rand_engine(rand_dev());

  Filtration_type res(number_of_parameters);
  for (unsigned int i = 0; i < number_of_parameters; ++i) res[i] = unif(rand_engine);

  return res;
}